

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

void ncnn::binary_op_broadcast<ncnn::binary_op_pow>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  size_t sVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  void *pvVar23;
  ulong uVar24;
  long lVar25;
  float *pfVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  int x;
  long lVar31;
  float *pfVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  int x_1;
  ulong uVar36;
  ulong uVar37;
  float fVar38;
  void *local_e0;
  
  iVar1 = c->dims;
  uVar18 = c->h;
  uVar2 = c->w;
  uVar19 = c->d;
  uVar3 = c->c;
  if (iVar1 == 2) {
    pvVar9 = a->data;
    iVar4 = a->w;
    pvVar23 = b->data;
    iVar5 = b->w;
    local_e0 = c->data;
    uVar24 = 0;
    uVar36 = 0;
    if (0 < (int)uVar2) {
      uVar36 = (ulong)uVar2;
    }
    uVar34 = 0;
    if (0 < (int)uVar18) {
      uVar34 = (ulong)uVar18;
    }
    sVar10 = c->elemsize;
    sVar11 = b->elemsize;
    uVar29 = (ulong)(b->h + -1);
    sVar13 = a->elemsize;
    uVar27 = (ulong)(a->h + -1);
    while( true ) {
      uVar37 = uVar29;
      if ((long)uVar24 < (long)uVar29) {
        uVar37 = uVar24;
      }
      uVar35 = uVar27;
      if ((long)uVar24 < (long)uVar27) {
        uVar35 = uVar24;
      }
      if (uVar24 == uVar34) break;
      pfVar26 = (float *)(uVar37 * (long)iVar5 * sVar11 + (long)pvVar23);
      pfVar32 = (float *)(uVar35 * (long)iVar4 * sVar13 + (long)pvVar9);
      for (uVar37 = 0; uVar36 != uVar37; uVar37 = uVar37 + 1) {
        fVar38 = powf(*pfVar32,*pfVar26);
        *(float *)((long)local_e0 + uVar37 * 4) = fVar38;
        pfVar26 = pfVar26 + (1 < (long)iVar5);
        pfVar32 = pfVar32 + (1 < (long)iVar4);
      }
      uVar24 = uVar24 + 1;
      local_e0 = (void *)((long)local_e0 + sVar10 * (long)(int)uVar2);
    }
  }
  else if (iVar1 == 1) {
    pfVar26 = (float *)a->data;
    pfVar32 = (float *)b->data;
    pvVar9 = c->data;
    iVar4 = a->w;
    iVar5 = b->w;
    uVar24 = 0;
    uVar36 = 0;
    if (0 < (int)uVar2) {
      uVar36 = (ulong)uVar2;
    }
    for (; uVar36 != uVar24; uVar24 = uVar24 + 1) {
      fVar38 = powf(*pfVar26,*pfVar32);
      *(float *)((long)pvVar9 + uVar24 * 4) = fVar38;
      pfVar32 = pfVar32 + (1 < iVar5);
      pfVar26 = pfVar26 + (1 < iVar4);
    }
  }
  if (iVar1 - 3U < 2) {
    sVar10 = c->cstep;
    sVar11 = c->elemsize;
    iVar1 = a->w;
    iVar4 = b->w;
    uVar36 = 0;
    uVar24 = 0;
    if (0 < (int)uVar2) {
      uVar24 = (ulong)uVar2;
    }
    if ((int)uVar18 < 1) {
      uVar18 = 0;
    }
    if ((int)uVar19 < 1) {
      uVar19 = 0;
    }
    uVar34 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar34 = uVar36;
    }
    pvVar9 = c->data;
    for (; uVar36 != uVar34; uVar36 = uVar36 + 1) {
      pvVar23 = (void *)(sVar10 * sVar11 * uVar36 + (long)pvVar9);
      for (lVar33 = 0; (uint)lVar33 != uVar19; lVar33 = lVar33 + 1) {
        iVar5 = a->w;
        iVar6 = a->h;
        pvVar12 = a->data;
        sVar13 = a->elemsize;
        iVar7 = b->w;
        iVar8 = b->h;
        pvVar14 = b->data;
        sVar15 = b->elemsize;
        uVar27 = (ulong)(a->c + -1);
        if ((long)uVar36 < (long)uVar27) {
          uVar27 = uVar36;
        }
        sVar16 = a->cstep;
        lVar28 = (long)(a->d + -1);
        if (lVar33 < lVar28) {
          lVar28 = lVar33;
        }
        uVar29 = (ulong)(b->c + -1);
        if ((long)uVar36 < (long)uVar29) {
          uVar29 = uVar36;
        }
        sVar17 = b->cstep;
        lVar30 = (long)(b->d + -1);
        if (lVar33 < lVar30) {
          lVar30 = lVar33;
        }
        lVar20 = (long)(iVar6 + -1);
        lVar21 = (long)(iVar8 + -1);
        lVar22 = 0;
        while( true ) {
          lVar25 = lVar20;
          if (lVar22 < lVar20) {
            lVar25 = lVar22;
          }
          lVar31 = lVar21;
          if (lVar22 < lVar21) {
            lVar31 = lVar22;
          }
          if ((uint)lVar22 == uVar18) break;
          pfVar26 = (float *)(((lVar25 + lVar28 * iVar6) * (long)iVar5 + uVar27 * sVar16) * sVar13 +
                             (long)pvVar12);
          pfVar32 = (float *)(((lVar31 + lVar30 * iVar8) * (long)iVar7 + uVar29 * sVar17) * sVar15 +
                             (long)pvVar14);
          for (uVar37 = 0; uVar24 != uVar37; uVar37 = uVar37 + 1) {
            fVar38 = powf(*pfVar26,*pfVar32);
            *(float *)((long)pvVar23 + uVar37 * 4) = fVar38;
            pfVar26 = pfVar26 + (1 < iVar1);
            pfVar32 = pfVar32 + (1 < iVar4);
          }
          pvVar23 = (void *)((long)pvVar23 + (long)(int)uVar2 * 4);
          lVar22 = lVar22 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void binary_op_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    // general broadcast
    const Op op;

    const int dims = c.dims;
    const int w = c.w;
    const int h = c.h;
    const int d = c.d;
    const int channels = c.c;

    if (dims == 1)
    {
        const float* ptr = a;
        const float* ptr1 = b;
        float* outptr = c;

        const int ainc = a.w > 1 ? 1 : 0;
        const int binc = b.w > 1 ? 1 : 0;

        for (int x = 0; x < w; x++)
        {
            outptr[x] = op(*ptr, *ptr1);
            ptr += ainc;
            ptr1 += binc;
        }
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(std::min(y, a.h - 1));
            const float* ptr1 = b.row(std::min(y, b.h - 1));
            float* outptr = c.row(y);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int x = 0; x < w; x++)
            {
                outptr[x] = op(*ptr, *ptr1);
                ptr += ainc;
                ptr1 += binc;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = c.channel(q);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int z = 0; z < d; z++)
            {
                for (int y = 0; y < h; y++)
                {
                    const float* ptr = a.channel(std::min(q, a.c - 1)).depth(std::min(z, a.d - 1)).row(std::min(y, a.h - 1));
                    const float* ptr1 = b.channel(std::min(q, b.c - 1)).depth(std::min(z, b.d - 1)).row(std::min(y, b.h - 1));

                    for (int x = 0; x < w; x++)
                    {
                        outptr[x] = op(*ptr, *ptr1);
                        ptr += ainc;
                        ptr1 += binc;
                    }

                    outptr += w;
                }
            }
        }
    }
}